

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QMimeXMLProvider::findByMagic(QMimeXMLProvider *this,QByteArray *data,QMimeMagicResult *result)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QArrayData *data_00;
  bool bVar4;
  uint uVar5;
  long lVar6;
  QMimeMagicRuleMatcher *matcher;
  QMimeMagicRuleMatcher *this_00;
  
  lVar6 = (this->m_magicMatchers).d.size;
  if (lVar6 != 0) {
    this_00 = (this->m_magicMatchers).d.ptr;
    lVar6 = lVar6 * 0x38;
    do {
      bVar4 = QMimeMagicRuleMatcher::matches(this_00,data);
      if ((bVar4) &&
         (uVar5 = QMimeMagicRuleMatcher::priority(this_00), result->accuracy < (int)uVar5)) {
        result->accuracy = uVar5;
        pDVar1 = (this_00->m_mimetype).d.d;
        pcVar2 = (this_00->m_mimetype).d.ptr;
        qVar3 = (this_00->m_mimetype).d.size;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        data_00 = &((result->candidate).d.d)->super_QArrayData;
        (result->candidate).d.d = pDVar1;
        (result->candidate).d.ptr = pcVar2;
        (result->candidate).d.size = qVar3;
        if (data_00 != (QArrayData *)0x0) {
          LOCK();
          (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
               (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data_00,2,0x10);
          }
        }
      }
      this_00 = this_00 + 1;
      lVar6 = lVar6 + -0x38;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }